

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Writer::WriteKetSteps_
          (OSTEI_HRR_Writer *this,ostream *os,HRRDoubletStepList *steps,string *tag,
          string *ncart_bra,string *brastr)

{
  pointer pHVar1;
  ostream *poVar2;
  pointer pHVar3;
  OSTEI_HRR_Writer *pOVar4;
  char *pcVar5;
  OSTEI_HRR_Writer local_110;
  Doublet src1;
  Doublet src0;
  Doublet target;
  
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"for(ibra = 0; ibra < ");
  poVar2 = std::operator<<(poVar2,(string *)ncart_bra);
  std::operator<<(poVar2,"; ++ibra)\n");
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar2,"{\n");
  pHVar1 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar3 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl
                .super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1) {
    Doublet::Doublet(&target,&pHVar3->target);
    Doublet::Doublet(&src0,(pHVar3->src)._M_elems);
    Doublet::Doublet(&src1,(pHVar3->src)._M_elems + 1);
    std::__cxx11::string::_M_assign((string *)&target.tag);
    std::__cxx11::string::_M_assign((string *)&src0.tag);
    std::__cxx11::string::_M_assign((string *)&src1.tag);
    pcVar5 = " + ";
    if (pHVar3->type == K) {
      pcVar5 = " - ";
    }
    local_110._vptr_OSTEI_HRR_Writer = (_func_int **)&local_110.info_;
    std::__cxx11::string::_M_construct((ulong)&local_110,'\x14');
    pOVar4 = &local_110;
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    HRRKetStepVar_((string *)&local_110,pOVar4,&target,brastr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pOVar4 = (OSTEI_HRR_Writer *)0x13abe1;
    std::operator<<(os," = ");
    HRRKetStepVar_((string *)&local_110,pOVar4,&src0,brastr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    poVar2 = std::operator<<(os,pcVar5);
    poVar2 = std::operator<<(poVar2,"( hCD[");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pHVar3->xyz);
    pOVar4 = (OSTEI_HRR_Writer *)0x13c969;
    std::operator<<(poVar2,"] * ");
    HRRKetStepVar_((string *)&local_110,pOVar4,&src1,brastr);
    std::operator<<(os,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::operator<<(os," );");
    std::operator<<(os,"\n\n");
    std::__cxx11::string::~string((string *)&src1.tag);
    std::__cxx11::string::~string((string *)&src0.tag);
    std::__cxx11::string::~string((string *)&target.tag);
  }
  poVar2 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  std::operator<<(poVar2,"}\n");
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteKetSteps_(std::ostream & os, const HRRDoubletStepList & steps,
                                      const std::string & tag,
                                      const std::string & ncart_bra, const std::string & brastr) const
{
    //if(info_.Vectorized())
    //    os << indent4 << "#pragma omp simd simdlen(SIMINT_SIMD_LEN)\n";

    os << indent4 << "for(ibra = 0; ibra < " << ncart_bra << "; ++ibra)\n"; 
    os << indent4 << "{\n"; 
    for(const auto & it : steps)
    {
        //os << std::string(20, ' ') << "// " << it << "\n";

        // add the appropriate integral tags
        Doublet target(it.target);
        Doublet src0(it.src[0]);
        Doublet src1(it.src[1]);
        target.tag = tag;
        src0.tag = tag;
        src1.tag = tag;

        const char * sign = " + ";
        if(it.type == RRStepType::K) // Moving from L->K
            sign = " - ";

        os << std::string(20, ' ');
    
        os << HRRKetStepVar_(target, brastr);

        os << " = ";

        os << HRRKetStepVar_(src0, brastr);
        os << sign << "( hCD[" << static_cast<int>(it.xyz) << "] * ";
        os << HRRKetStepVar_(src1, brastr);
        os << " );";
        os << "\n\n";
    }

    os << indent4 << "}\n"; 
}